

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writebmp.cpp
# Opt level: O3

void writeBMP(char *filename,float *data,int W,int H,float outputgamma)

{
  uint uVar1;
  char cVar2;
  char *data_00;
  ulong uVar3;
  double dVar4;
  
  uVar1 = W * H * 3;
  data_00 = (char *)operator_new__((long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      dVar4 = pow((double)data[uVar3],1.0 / (double)outputgamma);
      cVar2 = (char)(int)(dVar4 * 255.0);
      if (0xfe < (int)(dVar4 * 255.0)) {
        cVar2 = -1;
      }
      data_00[uVar3] = cVar2;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  writeBMP(filename,data_00,W,H);
  operator_delete__(data_00);
  return;
}

Assistant:

void writeBMP(const char* filename, float* data, int W, int H, float outputgamma = 2.2)
// data: RGB, top left -> bottom right, no padding
{
	char* bytedata = new char[W*H*3];
	for (int i=0; i<W*H*3; ++i)
		bytedata[i] = std::min(255, int(std::pow(data[i],1.0/outputgamma) *255));
	writeBMP(filename, bytedata, W, H);
	delete[] bytedata;
}